

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

Point3f pbrt::SampleSphericalRectangle
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point2f *u,Float *pdf)

{
  double dVar1;
  float __x;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Float FVar9;
  Float FVar10;
  float fVar11;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar12 [16];
  undefined1 auVar33 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar32 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [60];
  undefined1 auVar37 [64];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  Vector3<float> VVar43;
  Vector3f VVar44;
  Vector3<float> VVar45;
  Point3<float> PVar46;
  Tuple3<pbrt::Point3,_float> TVar47;
  Vector3f v01;
  Vector3f v11;
  Vector3f v10;
  float local_168;
  float fStack_164;
  Tuple3<pbrt::Vector3,_float> local_148;
  undefined1 local_138 [16];
  float local_128;
  Float local_124;
  Point3f *local_120;
  Tuple3<pbrt::Vector3,float> *local_118;
  Point3f *local_110;
  Tuple3<pbrt::Vector3,_float> local_108;
  Tuple3<pbrt::Vector3,_float> local_f8;
  Tuple3<pbrt::Vector3,_float> local_e8;
  undefined1 local_d8 [16];
  Tuple3<pbrt::Vector3,_float> local_c8;
  Tuple3<pbrt::Vector3,_float> local_b8;
  Tuple3<pbrt::Vector3,_float> local_a8;
  Frame local_9c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Vector3f local_54;
  Vector3<float> local_48;
  Vector3<float> local_3c;
  undefined1 extraout_var [60];
  
  fVar40 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar12 = ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40)),auVar12,auVar12);
  auVar7 = ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar12 = vfmadd213ss_fma(auVar7,auVar7,auVar12);
  fVar40 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar12 = vsqrtss_avx(auVar12,auVar12);
  auVar33 = ZEXT856(auVar12._8_8_);
  auVar7 = ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40)),auVar7,auVar7);
  auVar13 = ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar7 = vfmadd213ss_fma(auVar13,auVar13,auVar7);
  auVar7 = vsqrtss_avx(auVar7,auVar7);
  auVar38 = ZEXT1260(auVar7._4_12_);
  local_138._0_4_ = auVar12._0_4_;
  VVar43 = Tuple3<pbrt::Vector3,float>::operator/((Tuple3<pbrt::Vector3,float> *)ex,auVar12._0_4_);
  local_e8.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar17._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17._8_56_ = auVar33;
  local_e8._0_8_ = vmovlps_avx(auVar17._0_16_);
  auVar33 = (undefined1  [56])0x0;
  local_118 = (Tuple3<pbrt::Vector3,float> *)ey;
  VVar43 = Tuple3<pbrt::Vector3,float>::operator/((Tuple3<pbrt::Vector3,float> *)ey,auVar7._0_4_);
  local_a8.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18._8_56_ = auVar33;
  local_a8._0_8_ = vmovlps_avx(auVar18._0_16_);
  Frame::FromXY(&local_9c,(Vector3f *)&local_e8,(Vector3f *)&local_a8);
  local_120 = s;
  local_110 = pRef;
  VVar43 = Point3<float>::operator-(s,pRef);
  local_e8.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar19._8_56_ = auVar33;
  local_e8._0_8_ = vmovlps_avx(auVar19._0_16_);
  VVar44 = Frame::ToLocal(&local_9c,(Vector3f *)&local_e8);
  auVar37._0_4_ = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar37._4_60_ = auVar38;
  local_d8 = auVar37._0_16_;
  auVar20._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar20._8_56_ = auVar33;
  if (0.0 < auVar37._0_4_) {
    auVar12._0_8_ = local_9c.z.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
    auVar12._8_4_ = 0x80000000;
    auVar12._12_4_ = 0x80000000;
    local_d8._0_8_ = CONCAT44(auVar38._0_4_,auVar37._0_4_) ^ 0x8000000080000000;
    local_d8._8_4_ = auVar38._4_4_ ^ 0x80000000;
    local_d8._12_4_ = auVar38._8_4_ ^ 0x80000000;
    local_9c.z.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar12);
    local_9c.z.super_Tuple3<pbrt::Vector3,_float>.z =
         -local_9c.z.super_Tuple3<pbrt::Vector3,_float>.z;
  }
  local_128 = VVar44.super_Tuple3<pbrt::Vector3,_float>.x + (float)local_138._0_4_;
  local_68 = auVar20._0_16_;
  auVar12 = vmovshdup_avx(local_68);
  local_3c.super_Tuple3<pbrt::Vector3,_float>.y = auVar12._0_4_;
  local_48.super_Tuple3<pbrt::Vector3,_float>.y =
       local_3c.super_Tuple3<pbrt::Vector3,_float>.y + auVar7._0_4_;
  local_e8._0_8_ = vmovlps_avx(local_68);
  local_e8.z = local_d8._0_4_;
  local_a8.y = local_48.super_Tuple3<pbrt::Vector3,_float>.y;
  local_a8.x = VVar44.super_Tuple3<pbrt::Vector3,_float>.x;
  local_78 = ZEXT416((uint)local_48.super_Tuple3<pbrt::Vector3,_float>.y);
  local_a8.z = local_e8.z;
  local_48.super_Tuple3<pbrt::Vector3,_float>.x = local_128;
  local_48.super_Tuple3<pbrt::Vector3,_float>.z = local_e8.z;
  local_3c.super_Tuple3<pbrt::Vector3,_float>.x = local_128;
  local_3c.super_Tuple3<pbrt::Vector3,_float>.z = local_e8.z;
  VVar43 = Cross<float>((Vector3<float> *)&local_e8,&local_3c);
  local_b8.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21._8_56_ = auVar33;
  local_b8._0_8_ = vmovlps_avx(auVar21._0_16_);
  VVar43 = Normalize<float>((Vector3<float> *)&local_b8);
  auVar22._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar22._8_56_ = auVar33;
  local_138 = auVar22._0_16_;
  local_f8._0_8_ = vmovlps_avx(local_138);
  local_f8.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar45 = Cross<float>(&local_3c,&local_48);
  local_108.z = VVar45.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar23._0_8_ = VVar45.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar23._8_56_ = auVar33;
  local_108._0_8_ = vmovlps_avx(auVar23._0_16_);
  VVar45 = Normalize<float>((Vector3<float> *)&local_108);
  local_b8.z = VVar45.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar24._0_8_ = VVar45.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar24._8_56_ = auVar33;
  local_b8._0_8_ = vmovlps_avx(auVar24._0_16_);
  VVar45 = Cross<float>(&local_48,(Vector3<float> *)&local_a8);
  local_c8.z = VVar45.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar25._0_8_ = VVar45.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar25._8_56_ = auVar33;
  local_c8._0_8_ = vmovlps_avx(auVar25._0_16_);
  VVar45 = Normalize<float>((Vector3<float> *)&local_c8);
  local_108.z = VVar45.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar26._0_8_ = VVar45.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar26._8_56_ = auVar33;
  local_108._0_8_ = vmovlps_avx(auVar26._0_16_);
  VVar45 = Cross<float>((Vector3<float> *)&local_a8,(Vector3<float> *)&local_e8);
  local_148.z = VVar45.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._0_8_ = VVar45.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar27._8_56_ = auVar33;
  local_148._0_8_ = vmovlps_avx(auVar27._0_16_);
  VVar45 = Normalize<float>((Vector3<float> *)&local_148);
  local_c8.z = VVar45.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar28._0_8_ = VVar45.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar28._8_56_ = auVar33;
  local_c8._0_8_ = vmovlps_avx(auVar28._0_16_);
  auVar7._0_8_ = local_138._0_8_ ^ 0x8000000080000000;
  auVar7._8_4_ = local_138._8_4_ ^ 0x80000000;
  auVar7._12_4_ = local_138._12_4_ ^ 0x80000000;
  local_148.z = -VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  local_148._0_8_ = vmovlps_avx(auVar7);
  FVar9 = AngleBetween<float>((Vector3<float> *)&local_148,(Vector3<float> *)&local_b8);
  local_138._0_4_ = FVar9;
  auVar13._0_8_ = local_b8._0_8_ ^ 0x8000000080000000;
  auVar13._8_4_ = 0x80000000;
  auVar13._12_4_ = 0x80000000;
  local_148.z = -local_b8.z;
  local_148._0_8_ = vmovlps_avx(auVar13);
  local_124 = AngleBetween<float>((Vector3<float> *)&local_148,(Vector3<float> *)&local_108);
  auVar14._0_8_ = local_108._0_8_ ^ 0x8000000080000000;
  auVar14._8_4_ = 0x80000000;
  auVar14._12_4_ = 0x80000000;
  local_148.z = -local_108.z;
  local_148._0_8_ = vmovlps_avx(auVar14);
  FVar9 = AngleBetween<float>((Vector3<float> *)&local_148,(Vector3<float> *)&local_c8);
  auVar15._0_8_ = local_c8._0_8_ ^ 0x8000000080000000;
  auVar15._8_4_ = 0x80000000;
  auVar15._12_4_ = 0x80000000;
  local_148.z = -local_c8.z;
  local_148._0_8_ = vmovlps_avx(auVar15);
  FVar10 = AngleBetween<float>((Vector3<float> *)&local_148,(Vector3<float> *)&local_f8);
  if ((SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
       ::reg == '\0') &&
     (iVar6 = __cxa_guard_acquire(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
                                   ::reg), iVar6 != 0)) {
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)
               &SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
                ::reg,SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::
                      Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt
                      ::Point2<float>const&,float*)::$_0::__invoke(pbrt::StatsAccumulator__,
               (PixelAccumFunc)0x0);
    __cxa_guard_release(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
                         ::reg);
  }
  fVar40 = local_f8.z;
  *(long *)(in_FS_OFFSET + -0xf0) = *(long *)(in_FS_OFFSET + -0xf0) + 1;
  dVar1 = (double)(float)local_138._0_4_ + (double)local_124 + (double)FVar9 + (double)FVar10 +
          -6.2831854820251465;
  auVar16._0_4_ = (float)dVar1;
  auVar16._4_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar16._8_8_ = 0;
  if (auVar16._0_4_ <= 0.0) {
    *(long *)(in_FS_OFFSET + -0xf8) = *(long *)(in_FS_OFFSET + -0xf8) + 1;
    if (pdf != (Float *)0x0) {
      *pdf = 0.0;
    }
  }
  else {
    if (pdf != (Float *)0x0) {
      auVar34._0_4_ = 1.0 / auVar16._0_4_;
      auVar34._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar12 = vmaxss_avx(auVar34,ZEXT816(0));
      *pdf = auVar12._0_4_;
    }
    if (0.001 <= auVar16._0_4_) {
      auVar12 = vfmsub132ss_fma(auVar16,ZEXT416((uint)FVar9),
                                ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).x));
      fVar11 = auVar12._0_4_ - FVar10;
      local_138._0_4_ = local_108.z;
      auVar29._0_4_ = cosf(fVar11);
      auVar29._4_60_ = extraout_var;
      auVar12 = vfmsub132ss_fma(auVar29._0_16_,ZEXT416((uint)local_138._0_4_),ZEXT416((uint)fVar40))
      ;
      local_138._0_4_ = auVar12._0_4_;
      fVar11 = sinf(fVar11);
      auVar35._0_4_ = (float)local_138._0_4_ / fVar11;
      auVar35._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar12 = ZEXT416((uint)(fVar40 * fVar40 + auVar35._0_4_ * auVar35._0_4_));
      auVar12 = vsqrtss_avx(auVar12,auVar12);
      auVar33 = (undefined1  [56])0x0;
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar7 = vpternlogd_avx512vl(ZEXT416((uint)(1.0 / auVar12._0_4_)),auVar35,auVar4,0xe4);
      auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar7);
      uVar2 = vcmpss_avx512f(auVar7,SUB6416(ZEXT464(0xbf7fffff),0),1);
      bVar3 = (bool)((byte)uVar2 & 1);
      auVar8._4_12_ = auVar12._4_12_;
      auVar8._0_4_ = (float)((uint)bVar3 * -0x40800001 + (uint)!bVar3 * auVar12._0_4_);
      auVar5._8_4_ = 0x80000000;
      auVar5._0_8_ = 0x8000000080000000;
      auVar5._12_4_ = 0x80000000;
      auVar7 = vxorps_avx512vl(auVar8,auVar5);
      auVar36._0_12_ = ZEXT812(0);
      auVar36._12_4_ = 0;
      auVar12 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar8._0_4_ * auVar8._0_4_)),auVar36);
      auVar12 = vsqrtss_avx(auVar12,auVar12);
      auVar39._0_4_ = ((float)local_d8._0_4_ * auVar7._0_4_) / auVar12._0_4_;
      auVar39._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar12 = vminss_avx(ZEXT416((uint)local_128),auVar39);
      uVar2 = vcmpss_avx512f(auVar39,local_68,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      local_54.super_Tuple3<pbrt::Vector3,_float>.x =
           (float)((uint)bVar3 * local_68._0_4_ + (uint)!bVar3 * auVar12._0_4_);
      auVar42._4_12_ = local_68._4_12_;
      auVar42._0_4_ = local_78._0_4_;
      auVar12 = ZEXT416((uint)((float)local_d8._0_4_ * (float)local_d8._0_4_ +
                              local_54.super_Tuple3<pbrt::Vector3,_float>.x *
                              local_54.super_Tuple3<pbrt::Vector3,_float>.x));
      auVar12 = vsqrtss_avx(auVar12,auVar12);
      fVar11 = auVar12._0_4_;
      fVar40 = fVar11 * fVar11;
      auVar41._0_4_ = (float)local_78._0_4_ * (float)local_78._0_4_ + fVar40;
      auVar41._4_4_ = local_68._4_4_ * local_68._4_4_ + fVar40;
      auVar41._8_4_ = local_68._8_4_ * local_68._8_4_ + fVar40;
      auVar41._12_4_ = local_68._12_4_ * local_68._12_4_ + fVar40;
      auVar12 = vsqrtps_avx(auVar41);
      auVar12 = vdivps_avx(auVar42,auVar12);
      auVar7 = vhsubps_avx(auVar12,auVar12);
      auVar12 = vmovshdup_avx(auVar12);
      auVar12 = vfmadd132ss_fma(auVar7,auVar12,
                                ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).y));
      fVar40 = auVar12._0_4_;
      local_54.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_d8._0_4_;
      local_54.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_78._0_4_;
      if (fVar40 * fVar40 < 0.999999) {
        __x = 1.0 - fVar40 * fVar40;
        if (__x < 0.0) {
          auVar30._0_4_ = sqrtf(__x);
          auVar30._4_60_ = extraout_var_00;
          local_54.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_d8._0_4_;
        }
        else {
          auVar12 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
          auVar30 = ZEXT1664(auVar12);
        }
        auVar33 = auVar30._8_56_;
        local_54.super_Tuple3<pbrt::Vector3,_float>.y = (fVar11 * fVar40) / auVar30._0_4_;
      }
      VVar44 = Frame::FromLocal(&local_9c,&local_54);
      local_148.z = VVar44.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar32._0_8_ = VVar44.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar32._8_56_ = auVar33;
      local_148._0_8_ = vmovlps_avx(auVar32._0_16_);
      TVar47 = (Tuple3<pbrt::Point3,_float>)
               Point3<float>::operator+(local_110,(Vector3<float> *)&local_148);
      return (Point3f)TVar47;
    }
  }
  auVar33 = (undefined1  [56])0x0;
  VVar43 = Tuple3<pbrt::Vector3,float>::operator*
                     ((Tuple3<pbrt::Vector3,float> *)ex,(u->super_Tuple2<pbrt::Point2,_float>).x);
  local_148.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar31._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar31._8_56_ = auVar33;
  local_148._0_8_ = vmovlps_avx(auVar31._0_16_);
  PVar46 = Point3<float>::operator+(local_120,(Vector3<float> *)&local_148);
  VVar43 = Tuple3<pbrt::Vector3,float>::operator*
                     (local_118,(u->super_Tuple2<pbrt::Point2,_float>).y);
  local_168 = PVar46.super_Tuple3<pbrt::Point3,_float>.x;
  fStack_164 = PVar46.super_Tuple3<pbrt::Point3,_float>.y;
  TVar47.y = VVar43.super_Tuple3<pbrt::Vector3,_float>.y + fStack_164;
  TVar47.x = VVar43.super_Tuple3<pbrt::Vector3,_float>.x + local_168;
  TVar47.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z +
             PVar46.super_Tuple3<pbrt::Point3,_float>.z;
  return (Point3f)TVar47;
}

Assistant:

Point3f SampleSphericalRectangle(const Point3f &pRef, const Point3f &s,
                                 const Vector3f &ex, const Vector3f &ey, const Point2f &u,
                                 Float *pdf) {
    // Compute local reference frame and transform rectangle coordinates
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);
    Vector3f dLocal = R.ToLocal(s - pRef);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float x0 = dLocal.x, y0 = dLocal.y;
    Float x1 = x0 + exl, y1 = y0 + eyl;

    // Find plane normals to rectangle edges and compute internal angles
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);
    Vector3f n0 = Normalize(Cross(v00, v10)), n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01)), n3 = Normalize(Cross(v01, v00));
    Float g0 = AngleBetween(-n0, n1), g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3), g3 = AngleBetween(-n3, n0);

    // Compute spherical rectangle solid angle and PDF
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;
    CHECK_RARE(1e-5, solidAngle <= 0);
    if (solidAngle <= 0) {
        if (pdf != nullptr)
            *pdf = 0;
        return Point3f(s + u[0] * ex + u[1] * ey);
    }
    if (pdf != nullptr)
        *pdf = std::max<Float>(0, 1 / solidAngle);
    if (solidAngle < 1e-3)
        return Point3f(s + u[0] * ex + u[1] * ey);

    // Sample _cu_ for spherical rectangle sample
    Float b0 = n0.z, b1 = n2.z;
    // Float au = u[0] * solidAngle + k;   // original
    Float au = u[0] * solidAngle - g2 - g3;
    Float fu = (std::cos(au) * b0 - b1) / std::sin(au);
    Float cu = std::copysign(1 / std::sqrt(Sqr(fu) + Sqr(b0)), fu);
    cu = Clamp(cu, -OneMinusEpsilon, OneMinusEpsilon);  // avoid NaNs

    // Find _xu_ along $x$ edge for spherical rectangle sample
    Float xu = -(cu * z0) / SafeSqrt(1 - Sqr(cu));
    xu = Clamp(xu, x0, x1);

    // Find _xv_ along $y$ edge for spherical rectangle sample
    Float dd = std::sqrt(Sqr(xu) + Sqr(z0));
    Float h0 = y0 / std::sqrt(Sqr(dd) + Sqr(y0));
    Float h1 = y1 / std::sqrt(Sqr(dd) + Sqr(y1));
    Float hv = h0 + u[1] * (h1 - h0), hvsq = Sqr(hv);
    Float yv = (hvsq < 1 - 1e-6f) ? (hv * dd) / std::sqrt(1 - hvsq) : y1;

    // Return spherical triangle sample in original coordinate system
    return pRef + R.FromLocal(Vector3f(xu, yv, z0));
}